

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.cpp
# Opt level: O1

Type miniscript::internal::ComputeType
               (Fragment fragment,Type x,Type y,Type z,
               vector<miniscript::Type,_std::allocator<miniscript::Type>_> *sub_types,uint32_t k,
               size_t data_size,size_t n_subs,size_t n_keys,MiniscriptContext ms_ctx)

{
  pointer pTVar1;
  Fragment FVar2;
  uint uVar3;
  byte bVar4;
  short sVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  short sVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  byte bVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  long in_FS_OFFSET;
  bool bVar19;
  undefined1 auVar20 [16];
  uint local_54;
  
  FVar2 = fragment & ~JUST_1;
  if (FVar2 == RIPEMD160) {
    if (data_size != 0x14) {
      __assert_fail("data_size == 20",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.cpp"
                    ,0x2a,
                    "Type miniscript::internal::ComputeType(Fragment, Type, Type, Type, const std::vector<Type> &, uint32_t, size_t, size_t, size_t, MiniscriptContext)"
                   );
    }
  }
  else if (FVar2 == SHA256) {
    if (data_size != 0x20) {
      __assert_fail("data_size == 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.cpp"
                    ,0x28,
                    "Type miniscript::internal::ComputeType(Fragment, Type, Type, Type, const std::vector<Type> &, uint32_t, size_t, size_t, size_t, MiniscriptContext)"
                   );
    }
  }
  else if (data_size != 0) {
    __assert_fail("data_size == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.cpp"
                  ,0x2c,
                  "Type miniscript::internal::ComputeType(Fragment, Type, Type, Type, const std::vector<Type> &, uint32_t, size_t, size_t, size_t, MiniscriptContext)"
                 );
  }
  if (FVar2 == OLDER) {
    if ((int)k < 1) {
      __assert_fail("k >= 1 && k < 0x80000000UL",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.cpp"
                    ,0x30,
                    "Type miniscript::internal::ComputeType(Fragment, Type, Type, Type, const std::vector<Type> &, uint32_t, size_t, size_t, size_t, MiniscriptContext)"
                   );
    }
  }
  else if (fragment - MULTI < 2) {
    if ((k == 0) || (n_keys < k)) {
      __assert_fail("k >= 1 && k <= n_keys",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.cpp"
                    ,0x32,
                    "Type miniscript::internal::ComputeType(Fragment, Type, Type, Type, const std::vector<Type> &, uint32_t, size_t, size_t, size_t, MiniscriptContext)"
                   );
    }
  }
  else if (fragment == THRESH) {
    if ((k == 0) || (n_subs < k)) {
      __assert_fail("k >= 1 && k <= n_subs",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.cpp"
                    ,0x34,
                    "Type miniscript::internal::ComputeType(Fragment, Type, Type, Type, const std::vector<Type> &, uint32_t, size_t, size_t, size_t, MiniscriptContext)"
                   );
    }
  }
  else if (k != 0) {
    __assert_fail("k == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.cpp"
                  ,0x36,
                  "Type miniscript::internal::ComputeType(Fragment, Type, Type, Type, const std::vector<Type> &, uint32_t, size_t, size_t, size_t, MiniscriptContext)"
                 );
  }
  if (fragment - AND_V < 6) {
    if (n_subs != 2) {
      __assert_fail("n_subs == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.cpp"
                    ,0x3b,
                    "Type miniscript::internal::ComputeType(Fragment, Type, Type, Type, const std::vector<Type> &, uint32_t, size_t, size_t, size_t, MiniscriptContext)"
                   );
    }
  }
  else if (fragment - WRAP_A < 7) {
    if (n_subs != 1) {
      __assert_fail("n_subs == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.cpp"
                    ,0x41,
                    "Type miniscript::internal::ComputeType(Fragment, Type, Type, Type, const std::vector<Type> &, uint32_t, size_t, size_t, size_t, MiniscriptContext)"
                   );
    }
  }
  else if (fragment == ANDOR) {
    if (n_subs != 3) {
      __assert_fail("n_subs == 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.cpp"
                    ,0x3d,
                    "Type miniscript::internal::ComputeType(Fragment, Type, Type, Type, const std::vector<Type> &, uint32_t, size_t, size_t, size_t, MiniscriptContext)"
                   );
    }
  }
  else if (n_subs != 0 && fragment != THRESH) {
    __assert_fail("n_subs == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.cpp"
                  ,0x43,
                  "Type miniscript::internal::ComputeType(Fragment, Type, Type, Type, const std::vector<Type> &, uint32_t, size_t, size_t, size_t, MiniscriptContext)"
                 );
  }
  if (FVar2 == PK_K) {
    if (n_keys != 1) {
      __assert_fail("n_keys == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.cpp"
                    ,0x47,
                    "Type miniscript::internal::ComputeType(Fragment, Type, Type, Type, const std::vector<Type> &, uint32_t, size_t, size_t, size_t, MiniscriptContext)"
                   );
    }
  }
  else if (fragment == MULTI_A) {
    if (0x3e6 < n_keys - 1) {
      __assert_fail("n_keys >= 1 && n_keys <= MAX_PUBKEYS_PER_MULTI_A",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.cpp"
                    ,0x4c,
                    "Type miniscript::internal::ComputeType(Fragment, Type, Type, Type, const std::vector<Type> &, uint32_t, size_t, size_t, size_t, MiniscriptContext)"
                   );
    }
    if (ms_ctx != TAPSCRIPT) {
      if (ms_ctx == P2WSH) {
        __assert_fail("IsTapscript(ms_ctx)",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.cpp"
                      ,0x4d,
                      "Type miniscript::internal::ComputeType(Fragment, Type, Type, Type, const std::vector<Type> &, uint32_t, size_t, size_t, size_t, MiniscriptContext)"
                     );
      }
      goto LAB_00df0169;
    }
  }
  else if (fragment == MULTI) {
    if (0x13 < n_keys - 1) {
      __assert_fail("n_keys >= 1 && n_keys <= MAX_PUBKEYS_PER_MULTISIG",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.cpp"
                    ,0x49,
                    "Type miniscript::internal::ComputeType(Fragment, Type, Type, Type, const std::vector<Type> &, uint32_t, size_t, size_t, size_t, MiniscriptContext)"
                   );
    }
    if (ms_ctx != P2WSH) {
      if (ms_ctx == TAPSCRIPT) {
        __assert_fail("!IsTapscript(ms_ctx)",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.cpp"
                      ,0x4a,
                      "Type miniscript::internal::ComputeType(Fragment, Type, Type, Type, const std::vector<Type> &, uint32_t, size_t, size_t, size_t, MiniscriptContext)"
                     );
      }
      goto LAB_00df0169;
    }
  }
  else if (n_keys != 0) {
    __assert_fail("n_keys == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.cpp"
                  ,0x4f,
                  "Type miniscript::internal::ComputeType(Fragment, Type, Type, Type, const std::vector<Type> &, uint32_t, size_t, size_t, size_t, MiniscriptContext)"
                 );
  }
  uVar3 = 0x43be4;
  sVar9 = (short)x.m_flags;
  sVar5 = (short)y.m_flags;
  switch(fragment) {
  case JUST_0:
    uVar3 = 0x43b91;
    break;
  case JUST_1:
    uVar3 = 0x43511;
    break;
  case PK_K:
    break;
  case PK_H:
    uVar3 = 0x43bc4;
    break;
  case OLDER:
    uVar3 = ((k & 0x400000) >> 7 | (k & 0x400000) >> 8) ^ 0x4b411;
    break;
  case AFTER:
    uVar3 = (uint)(k >= 500000000) * 0x10000 + (uint)(k < 500000000) * 0x20000 + 0x43411;
    break;
  case SHA256:
  case HASH256:
  case RIPEMD160:
  case HASH160:
    uVar3 = 0x411e1;
    break;
  case WRAP_A:
    uVar3 = (x.m_flags & 0x7df80) + (x.m_flags & 1) * 8 + 0x2000;
    break;
  case WRAP_S:
    uVar3 = (x.m_flags & 0x7ff80) + (uint)((~x.m_flags & 0x21) == 0) * 8;
    break;
  case WRAP_C:
    uVar3 = (x.m_flags >> 2 & 1) + (x.m_flags & 0x7d6e0) + 0x900;
    break;
  case WRAP_D:
    if (ms_ctx != P2WSH) {
      if (ms_ctx != TAPSCRIPT) {
LAB_00df0169:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h"
                      ,0xf6,"bool miniscript::IsTapscript(MiniscriptContext)");
      }
      ms_ctx = 0x100;
    }
    uVar3 = ms_ctx + (x.m_flags & 0x7d800 | x.m_flags * 2 & 0x20 | x.m_flags >> 1 & 0x200 |
                     (uint)((~x.m_flags & 0x12) == 0)) + 0x20c0;
    break;
  case WRAP_V:
    uVar3 = (x.m_flags & 0x7d870) + (x.m_flags & 1) * 2 + 0x2400;
    break;
  case WRAP_J:
    uVar3 = (uint)((~x.m_flags & 0x41) == 0) + (x.m_flags & 0x7d920 | x.m_flags >> 1 & 0x200) +
            0x20c0;
    break;
  case WRAP_N:
    uVar3 = x.m_flags & 0x7def1 | 0x2100;
    break;
  case AND_V:
    uVar3 = y.m_flags | x.m_flags;
    uVar10 = 0;
    if (((((y.m_flags & x.m_flags) >> 0x12 & 1) != 0) &&
        (((byte)(x.m_flags >> 0xe) & sVar5 < 0) == 0)) &&
       ((uVar10 = 0, (sVar9 < 0 & (byte)(y.m_flags >> 0xe) & 1) == 0 &&
        (((y.m_flags >> 0x11 & x.m_flags >> 0x10 & 1) == 0 &&
         (uVar10 = 0x40000, (x.m_flags >> 0x11 & 1) != 0)))))) {
      uVar10 = (~y.m_flags & 0x10000) << 2;
    }
    uVar10 = (uint)((x.m_flags & 0x800) != 0 || (y.m_flags & 0x400) != 0) << 10 | uVar10;
    uVar3 = y.m_flags & x.m_flags & 0x1090 | uVar3 & 0x3c800 | uVar3 * 2 & uVar3 & 0x20 |
            y.m_flags & 0x2100 | x.m_flags & 0x40 | x.m_flags * 4 & y.m_flags & 0x40 |
            (int)(x.m_flags << 0x1e) >> 0x1f & y.m_flags & 7;
    goto LAB_00defcac;
  case AND_B:
    uVar11 = y.m_flags | x.m_flags;
    uVar17 = y.m_flags & x.m_flags;
    uVar10 = 0;
    uVar3 = 0;
    if (((((uVar17 >> 0x12 & 1) != 0) &&
         (uVar3 = uVar10, ((byte)(x.m_flags >> 0xe) & sVar5 < 0) == 0)) &&
        ((sVar9 < 0 & (byte)(y.m_flags >> 0xe) & 1) == 0)) &&
       (((y.m_flags >> 0x11 & x.m_flags >> 0x10 & 1) == 0 &&
        (uVar3 = 0x40000, (x.m_flags >> 0x11 & 1) != 0)))) {
      uVar3 = (~y.m_flags & 0x10000) << 2;
    }
    uVar3 = uVar11 * 2 & uVar11 & 0x20 | uVar17 >> 2 & uVar17 & 0x200 |
            uVar17 & 0x1090 | uVar11 & 0x3c800 | y.m_flags >> 3 & x.m_flags & 1 |
            x.m_flags & 0x40 | x.m_flags * 4 & y.m_flags & 0x40 | uVar3 |
            (uint)(((~y.m_flags & 0xc00) == 0 || (~x.m_flags & 0xc00) == 0) |
                  (byte)(uVar17 >> 10) & 1) << 10 | 0x2100;
    break;
  case OR_B:
    uVar11 = y.m_flags | x.m_flags;
    uVar10 = y.m_flags & x.m_flags;
    uVar3 = uVar10 >> 9 & 1;
    if (uVar3 != 0) {
      uVar3 = uVar10 & 0x1000;
    }
    if ((uVar11 >> 0xb & 1) == 0) {
      uVar3 = 0;
    }
    uVar3 = uVar3 + (uVar10 & 0x40a10 | uVar11 & 0x3c000 |
                     (uint)((~y.m_flags & 0x88) == 0 && (~x.m_flags & 0x81) == 0) |
                    uVar11 * 2 & uVar11 & 0x20) + 0x2180;
    break;
  case OR_C:
    uVar3 = y.m_flags & 2 | 0x2400;
    uVar11 = y.m_flags & x.m_flags;
    uVar10 = (y.m_flags | x.m_flags) >> 0xb & 1;
    if (uVar10 != 0) {
      uVar10 = uVar11 & 0x1000;
    }
    if ((x.m_flags >> 9 & 1) == 0) {
      uVar10 = 0;
    }
    if ((~x.m_flags & 0x181) != 0) {
      uVar3 = 0x2400;
    }
    uVar3 = uVar3 | uVar11 & 0x810 | (y.m_flags | x.m_flags) & 0x3c000 | uVar11 & 0x40000 |
            y.m_flags * 2 & x.m_flags & 0x20;
LAB_00defcac:
    uVar3 = uVar3 | uVar10;
    break;
  case OR_D:
    uVar10 = y.m_flags & x.m_flags;
    uVar3 = (y.m_flags | x.m_flags) >> 0xb & 1;
    if (uVar3 != 0) {
      uVar3 = uVar10 & 0x1000;
    }
    if ((x.m_flags >> 9 & 1) == 0) {
      uVar3 = 0;
    }
    uVar3 = uVar3 | y.m_flags * 2 & x.m_flags & 0x20 |
            uVar10 & 0x40000 |
            (y.m_flags | x.m_flags) & 0x3c000 |
            y.m_flags & ((~x.m_flags & 0x181) == 0 | 0x780) | uVar10 & 0x810;
    goto LAB_00df0092;
  case OR_I:
    uVar3 = y.m_flags & x.m_flags;
    uVar10 = y.m_flags | x.m_flags;
    uVar3 = ((uVar3 & 0x40d07 | uVar10 & 0x3c080) + (uVar3 & 0x10) * 2 |
            uVar10 >> 1 & uVar10 & 0x200) + (uVar10 * 2 & uVar3 & 0x1000) + 0x2000;
    break;
  case ANDOR:
    uVar11 = z.m_flags & y.m_flags;
    uVar10 = 0;
    uVar3 = uVar11 & 7;
    if ((~x.m_flags & 0x181) != 0) {
      uVar3 = uVar10;
    }
    uVar15 = y.m_flags & x.m_flags & z.m_flags;
    uVar7 = z.m_flags & 0x200;
    uVar17 = z.m_flags & 0x400;
    if ((y.m_flags & 0x400) == 0 && (x.m_flags & 0x800) == 0) {
      uVar7 = 0;
      uVar17 = 0;
    }
    uVar6 = 0;
    if ((x.m_flags >> 9 & 1) != 0) {
      uVar6 = (y.m_flags | x.m_flags | z.m_flags) * 2 & uVar15 & 0x1000;
    }
    if ((((uVar15 >> 0x12 & 1) != 0) && (-1 < sVar5 || (x.m_flags >> 0xe & 1) == 0)) &&
       (((y.m_flags >> 0xe & 1) == 0 || -1 < sVar9 &&
        ((uVar10 = 0, (y.m_flags >> 0x11 & 1) == 0 || (x.m_flags >> 0x10 & 1) == 0 &&
         (uVar10 = 0x40000, (x.m_flags >> 0x11 & 1) != 0)))))) {
      uVar10 = (~y.m_flags & 0x10000) << 2;
    }
    uVar3 = (uVar11 | x.m_flags) * 2 & (uVar11 | x.m_flags) & 0x20 | uVar6 | uVar10 |
            uVar17 | uVar7 |
            (y.m_flags | x.m_flags | z.m_flags) & 0x3c000 | uVar3 |
            uVar11 & 0x100 | z.m_flags & (y.m_flags | x.m_flags) & 0x800 |
            z.m_flags & 0x80 | uVar15 & 0x10;
LAB_00df0092:
    uVar3 = uVar3 | 0x2000;
    break;
  case THRESH:
    pTVar1 = (sub_types->super__Vector_base<miniscript::Type,_std::allocator<miniscript::Type>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar3 = 0;
    lVar12 = (long)(sub_types->
                   super__Vector_base<miniscript::Type,_std::allocator<miniscript::Type>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pTVar1;
    bVar19 = lVar12 != 0;
    if (lVar12 == 0) {
      bVar4 = 1;
      uVar10 = 0x40000;
      uVar13 = 0;
      iVar16 = 0;
      bVar14 = 1;
    }
    else {
      uVar13 = lVar12 >> 2;
      iVar16 = 0;
      uVar10 = 0x40000;
      bVar14 = 1;
      uVar18 = 1;
      bVar4 = 1;
      local_54 = 0;
      do {
        uVar11 = pTVar1[uVar18 - 1].m_flags;
        uVar17 = 0xfffffe77;
        if (uVar18 == 1) {
          uVar17 = 0xfffffe7e;
        }
        if ((uVar17 | uVar11) == 0xffffffff) {
          auVar20._0_4_ = -(uint)((uVar11 & 0x20) == 0);
          auVar20._4_4_ = -(uint)((uVar11 & 0x10) == 0);
          auVar20._8_4_ = -(uint)((uVar11 & 0x1000) == 0);
          auVar20._12_4_ = -(uint)((uVar11 & 0x200) == 0);
          iVar8 = 0;
          local_54 = local_54 + ((uVar11 >> 0xb & 1) != 0);
          uVar7 = movmskps(0xfffffe7e,auVar20);
          if ((uVar7 & 8) != 0) {
            bVar14 = 0;
          }
          if ((uVar7 & 4) != 0) {
            bVar4 = 0;
          }
          if ((uVar7 & 2) != 0) {
            iVar8 = (uVar7 & 1) + 1;
          }
          uVar7 = uVar10 & uVar11 & 0x40000;
          if (uVar7 != 0 && 1 < k) {
            if (((((uVar10 >> 0xe & 1) == 0) || (uVar7 = 0, (uVar11 & 0x8000) == 0)) &&
                ((uVar7 = 0, -1 < (short)uVar10 || ((uVar11 & 0x4000) == 0)))) &&
               ((((uVar10 >> 0x10 & 1) == 0 || ((uVar11 & 0x20000) == 0)) &&
                (uVar7 = 0x40000, (uVar10 >> 0x11 & 1) != 0)))) {
              uVar7 = (~uVar11 & 0x10000) << 2;
            }
          }
          iVar16 = iVar16 + iVar8;
          uVar10 = (uVar11 | uVar10) & 0x3c000 | uVar7;
        }
        if ((uVar17 | uVar11) != 0xffffffff) break;
        bVar19 = uVar18 < uVar13;
        lVar12 = (-(ulong)(uVar13 == 0) - uVar13) + uVar18;
        uVar18 = uVar18 + 1;
      } while (lVar12 != 0);
      uVar13 = (ulong)local_54;
    }
    if (!bVar19) {
      uVar3 = 1;
      if (iVar16 == 1) {
        uVar3 = 0x20;
      }
      uVar11 = 0;
      if ((bVar4 & bVar14) != 0) {
        uVar11 = (uint)(n_subs - k <= uVar13) << 0xc;
      }
      uVar3 = (uint)(uVar13 == n_subs & bVar14) << 9 | uVar3 | uVar10 | (uint)(iVar16 == 0) << 4 |
              (uint)((n_subs - k) + 1 <= uVar13) << 0xb | uVar11 | 0x181;
    }
    break;
  case MULTI:
    uVar3 = 0x41bc1;
    break;
  case MULTI_A:
    uVar3 = 0x41b81;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.cpp"
                  ,0x103,
                  "Type miniscript::internal::ComputeType(Fragment, Type, Type, Type, const std::vector<Type> &, uint32_t, size_t, size_t, size_t, MiniscriptContext)"
                 );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return (Type)uVar3;
  }
  __stack_chk_fail();
}

Assistant:

Type ComputeType(Fragment fragment, Type x, Type y, Type z, const std::vector<Type>& sub_types, uint32_t k,
                 size_t data_size, size_t n_subs, size_t n_keys, MiniscriptContext ms_ctx) {
    // Sanity check on data
    if (fragment == Fragment::SHA256 || fragment == Fragment::HASH256) {
        assert(data_size == 32);
    } else if (fragment == Fragment::RIPEMD160 || fragment == Fragment::HASH160) {
        assert(data_size == 20);
    } else {
        assert(data_size == 0);
    }
    // Sanity check on k
    if (fragment == Fragment::OLDER || fragment == Fragment::AFTER) {
        assert(k >= 1 && k < 0x80000000UL);
    } else if (fragment == Fragment::MULTI || fragment == Fragment::MULTI_A) {
        assert(k >= 1 && k <= n_keys);
    } else if (fragment == Fragment::THRESH) {
        assert(k >= 1 && k <= n_subs);
    } else {
        assert(k == 0);
    }
    // Sanity check on subs
    if (fragment == Fragment::AND_V || fragment == Fragment::AND_B || fragment == Fragment::OR_B ||
        fragment == Fragment::OR_C || fragment == Fragment::OR_I || fragment == Fragment::OR_D) {
        assert(n_subs == 2);
    } else if (fragment == Fragment::ANDOR) {
        assert(n_subs == 3);
    } else if (fragment == Fragment::WRAP_A || fragment == Fragment::WRAP_S || fragment == Fragment::WRAP_C ||
               fragment == Fragment::WRAP_D || fragment == Fragment::WRAP_V || fragment == Fragment::WRAP_J ||
               fragment == Fragment::WRAP_N) {
        assert(n_subs == 1);
    } else if (fragment != Fragment::THRESH) {
        assert(n_subs == 0);
    }
    // Sanity check on keys
    if (fragment == Fragment::PK_K || fragment == Fragment::PK_H) {
        assert(n_keys == 1);
    } else if (fragment == Fragment::MULTI) {
        assert(n_keys >= 1 && n_keys <= MAX_PUBKEYS_PER_MULTISIG);
        assert(!IsTapscript(ms_ctx));
    } else if (fragment == Fragment::MULTI_A) {
        assert(n_keys >= 1 && n_keys <= MAX_PUBKEYS_PER_MULTI_A);
        assert(IsTapscript(ms_ctx));
    } else {
        assert(n_keys == 0);
    }

    // Below is the per-fragment logic for computing the expression types.
    // It heavily relies on Type's << operator (where "X << a_mst" means
    // "X has all properties listed in a").
    switch (fragment) {
        case Fragment::PK_K: return "Konudemsxk"_mst;
        case Fragment::PK_H: return "Knudemsxk"_mst;
        case Fragment::OLDER: return
            "g"_mst.If(k & CTxIn::SEQUENCE_LOCKTIME_TYPE_FLAG) |
            "h"_mst.If(!(k & CTxIn::SEQUENCE_LOCKTIME_TYPE_FLAG)) |
            "Bzfmxk"_mst;
        case Fragment::AFTER: return
            "i"_mst.If(k >= LOCKTIME_THRESHOLD) |
            "j"_mst.If(k < LOCKTIME_THRESHOLD) |
            "Bzfmxk"_mst;
        case Fragment::SHA256: return "Bonudmk"_mst;
        case Fragment::RIPEMD160: return "Bonudmk"_mst;
        case Fragment::HASH256: return "Bonudmk"_mst;
        case Fragment::HASH160: return "Bonudmk"_mst;
        case Fragment::JUST_1: return "Bzufmxk"_mst;
        case Fragment::JUST_0: return "Bzudemsxk"_mst;
        case Fragment::WRAP_A: return
            "W"_mst.If(x << "B"_mst) | // W=B_x
            (x & "ghijk"_mst) | // g=g_x, h=h_x, i=i_x, j=j_x, k=k_x
            (x & "udfems"_mst) | // u=u_x, d=d_x, f=f_x, e=e_x, m=m_x, s=s_x
            "x"_mst; // x
        case Fragment::WRAP_S: return
            "W"_mst.If(x << "Bo"_mst) | // W=B_x*o_x
            (x & "ghijk"_mst) | // g=g_x, h=h_x, i=i_x, j=j_x, k=k_x
            (x & "udfemsx"_mst); // u=u_x, d=d_x, f=f_x, e=e_x, m=m_x, s=s_x, x=x_x
        case Fragment::WRAP_C: return
            "B"_mst.If(x << "K"_mst) | // B=K_x
            (x & "ghijk"_mst) | // g=g_x, h=h_x, i=i_x, j=j_x, k=k_x
            (x & "ondfem"_mst) | // o=o_x, n=n_x, d=d_x, f=f_x, e=e_x, m=m_x
            "us"_mst; // u, s
        case Fragment::WRAP_D: return
            "B"_mst.If(x << "Vz"_mst) | // B=V_x*z_x
            "o"_mst.If(x << "z"_mst) | // o=z_x
            "e"_mst.If(x << "f"_mst) | // e=f_x
            (x & "ghijk"_mst) | // g=g_x, h=h_x, i=i_x, j=j_x, k=k_x
            (x & "ms"_mst) | // m=m_x, s=s_x
            // NOTE: 'd:' is 'u' under Tapscript but not P2WSH as MINIMALIF is only a policy rule there.
            "u"_mst.If(IsTapscript(ms_ctx)) |
            "ndx"_mst; // n, d, x
        case Fragment::WRAP_V: return
            "V"_mst.If(x << "B"_mst) | // V=B_x
            (x & "ghijk"_mst) | // g=g_x, h=h_x, i=i_x, j=j_x, k=k_x
            (x & "zonms"_mst) | // z=z_x, o=o_x, n=n_x, m=m_x, s=s_x
            "fx"_mst; // f, x
        case Fragment::WRAP_J: return
            "B"_mst.If(x << "Bn"_mst) | // B=B_x*n_x
            "e"_mst.If(x << "f"_mst) | // e=f_x
            (x & "ghijk"_mst) | // g=g_x, h=h_x, i=i_x, j=j_x, k=k_x
            (x & "oums"_mst) | // o=o_x, u=u_x, m=m_x, s=s_x
            "ndx"_mst; // n, d, x
        case Fragment::WRAP_N: return
            (x & "ghijk"_mst) | // g=g_x, h=h_x, i=i_x, j=j_x, k=k_x
            (x & "Bzondfems"_mst) | // B=B_x, z=z_x, o=o_x, n=n_x, d=d_x, f=f_x, e=e_x, m=m_x, s=s_x
            "ux"_mst; // u, x
        case Fragment::AND_V: return
            (y & "KVB"_mst).If(x << "V"_mst) | // B=V_x*B_y, V=V_x*V_y, K=V_x*K_y
            (x & "n"_mst) | (y & "n"_mst).If(x << "z"_mst) | // n=n_x+z_x*n_y
            ((x | y) & "o"_mst).If((x | y) << "z"_mst) | // o=o_x*z_y+z_x*o_y
            (x & y & "dmz"_mst) | // d=d_x*d_y, m=m_x*m_y, z=z_x*z_y
            ((x | y) & "s"_mst) | // s=s_x+s_y
            "f"_mst.If((y << "f"_mst) || (x << "s"_mst)) | // f=f_y+s_x
            (y & "ux"_mst) | // u=u_y, x=x_y
            ((x | y) & "ghij"_mst) | // g=g_x+g_y, h=h_x+h_y, i=i_x+i_y, j=j_x+j_y
            "k"_mst.If(((x & y) << "k"_mst) &&
                !(((x << "g"_mst) && (y << "h"_mst)) ||
                ((x << "h"_mst) && (y << "g"_mst)) ||
                ((x << "i"_mst) && (y << "j"_mst)) ||
                ((x << "j"_mst) && (y << "i"_mst)))); // k=k_x*k_y*!(g_x*h_y + h_x*g_y + i_x*j_y + j_x*i_y)
        case Fragment::AND_B: return
            (x & "B"_mst).If(y << "W"_mst) | // B=B_x*W_y
            ((x | y) & "o"_mst).If((x | y) << "z"_mst) | // o=o_x*z_y+z_x*o_y
            (x & "n"_mst) | (y & "n"_mst).If(x << "z"_mst) | // n=n_x+z_x*n_y
            (x & y & "e"_mst).If((x & y) << "s"_mst) | // e=e_x*e_y*s_x*s_y
            (x & y & "dzm"_mst) | // d=d_x*d_y, z=z_x*z_y, m=m_x*m_y
            "f"_mst.If(((x & y) << "f"_mst) || (x << "sf"_mst) || (y << "sf"_mst)) | // f=f_x*f_y + f_x*s_x + f_y*s_y
            ((x | y) & "s"_mst) | // s=s_x+s_y
            "ux"_mst | // u, x
            ((x | y) & "ghij"_mst) | // g=g_x+g_y, h=h_x+h_y, i=i_x+i_y, j=j_x+j_y
            "k"_mst.If(((x & y) << "k"_mst) &&
                !(((x << "g"_mst) && (y << "h"_mst)) ||
                ((x << "h"_mst) && (y << "g"_mst)) ||
                ((x << "i"_mst) && (y << "j"_mst)) ||
                ((x << "j"_mst) && (y << "i"_mst)))); // k=k_x*k_y*!(g_x*h_y + h_x*g_y + i_x*j_y + j_x*i_y)
        case Fragment::OR_B: return
            "B"_mst.If(x << "Bd"_mst && y << "Wd"_mst) | // B=B_x*d_x*W_x*d_y
            ((x | y) & "o"_mst).If((x | y) << "z"_mst) | // o=o_x*z_y+z_x*o_y
            (x & y & "m"_mst).If((x | y) << "s"_mst && (x & y) << "e"_mst) | // m=m_x*m_y*e_x*e_y*(s_x+s_y)
            (x & y & "zse"_mst) | // z=z_x*z_y, s=s_x*s_y, e=e_x*e_y
            "dux"_mst | // d, u, x
            ((x | y) & "ghij"_mst) | // g=g_x+g_y, h=h_x+h_y, i=i_x+i_y, j=j_x+j_y
            (x & y & "k"_mst); // k=k_x*k_y
        case Fragment::OR_D: return
            (y & "B"_mst).If(x << "Bdu"_mst) | // B=B_y*B_x*d_x*u_x
            (x & "o"_mst).If(y << "z"_mst) | // o=o_x*z_y
            (x & y & "m"_mst).If(x << "e"_mst && (x | y) << "s"_mst) | // m=m_x*m_y*e_x*(s_x+s_y)
            (x & y & "zs"_mst) | // z=z_x*z_y, s=s_x*s_y
            (y & "ufde"_mst) | // u=u_y, f=f_y, d=d_y, e=e_y
            "x"_mst | // x
            ((x | y) & "ghij"_mst) | // g=g_x+g_y, h=h_x+h_y, i=i_x+i_y, j=j_x+j_y
            (x & y & "k"_mst); // k=k_x*k_y
        case Fragment::OR_C: return
            (y & "V"_mst).If(x << "Bdu"_mst) | // V=V_y*B_x*u_x*d_x
            (x & "o"_mst).If(y << "z"_mst) | // o=o_x*z_y
            (x & y & "m"_mst).If(x << "e"_mst && (x | y) << "s"_mst) | // m=m_x*m_y*e_x*(s_x+s_y)
            (x & y & "zs"_mst) | // z=z_x*z_y, s=s_x*s_y
            "fx"_mst | // f, x
            ((x | y) & "ghij"_mst) | // g=g_x+g_y, h=h_x+h_y, i=i_x+i_y, j=j_x+j_y
            (x & y & "k"_mst); // k=k_x*k_y
        case Fragment::OR_I: return
            (x & y & "VBKufs"_mst) | // V=V_x*V_y, B=B_x*B_y, K=K_x*K_y, u=u_x*u_y, f=f_x*f_y, s=s_x*s_y
            "o"_mst.If((x & y) << "z"_mst) | // o=z_x*z_y
            ((x | y) & "e"_mst).If((x | y) << "f"_mst) | // e=e_x*f_y+f_x*e_y
            (x & y & "m"_mst).If((x | y) << "s"_mst) | // m=m_x*m_y*(s_x+s_y)
            ((x | y) & "d"_mst) | // d=d_x+d_y
            "x"_mst | // x
            ((x | y) & "ghij"_mst) | // g=g_x+g_y, h=h_x+h_y, i=i_x+i_y, j=j_x+j_y
            (x & y & "k"_mst); // k=k_x*k_y
        case Fragment::ANDOR: return
            (y & z & "BKV"_mst).If(x << "Bdu"_mst) | // B=B_x*d_x*u_x*B_y*B_z, K=B_x*d_x*u_x*K_y*K_z, V=B_x*d_x*u_x*V_y*V_z
            (x & y & z & "z"_mst) | // z=z_x*z_y*z_z
            ((x | (y & z)) & "o"_mst).If((x | (y & z)) << "z"_mst) | // o=o_x*z_y*z_z+z_x*o_y*o_z
            (y & z & "u"_mst) | // u=u_y*u_z
            (z & "f"_mst).If((x << "s"_mst) || (y << "f"_mst)) | // f=(s_x+f_y)*f_z
            (z & "d"_mst) | // d=d_z
            (z & "e"_mst).If(x << "s"_mst || y << "f"_mst) | // e=e_z*(s_x+f_y)
            (x & y & z & "m"_mst).If(x << "e"_mst && (x | y | z) << "s"_mst) | // m=m_x*m_y*m_z*e_x*(s_x+s_y+s_z)
            (z & (x | y) & "s"_mst) | // s=s_z*(s_x+s_y)
            "x"_mst | // x
            ((x | y | z) & "ghij"_mst) | // g=g_x+g_y+g_z, h=h_x+h_y+h_z, i=i_x+i_y+i_z, j=j_x+j_y_j_z
            "k"_mst.If(((x & y & z) << "k"_mst) &&
                !(((x << "g"_mst) && (y << "h"_mst)) ||
                ((x << "h"_mst) && (y << "g"_mst)) ||
                ((x << "i"_mst) && (y << "j"_mst)) ||
                ((x << "j"_mst) && (y << "i"_mst)))); // k=k_x*k_y*k_z* !(g_x*h_y + h_x*g_y + i_x*j_y + j_x*i_y)
        case Fragment::MULTI: {
            return "Bnudemsk"_mst;
        }
        case Fragment::MULTI_A: {
            return "Budemsk"_mst;
        }
        case Fragment::THRESH: {
            bool all_e = true;
            bool all_m = true;
            uint32_t args = 0;
            uint32_t num_s = 0;
            Type acc_tl = "k"_mst;
            for (size_t i = 0; i < sub_types.size(); ++i) {
                Type t = sub_types[i];
                static constexpr auto WDU{"Wdu"_mst}, BDU{"Bdu"_mst};
                if (!(t << (i ? WDU : BDU))) return ""_mst; // Require Bdu, Wdu, Wdu, ...
                if (!(t << "e"_mst)) all_e = false;
                if (!(t << "m"_mst)) all_m = false;
                if (t << "s"_mst) num_s += 1;
                args += (t << "z"_mst) ? 0 : (t << "o"_mst) ? 1 : 2;
                acc_tl = ((acc_tl | t) & "ghij"_mst) |
                    // Thresh contains a combination of timelocks if it has threshold > 1 and
                    // it contains two different children that have different types of timelocks
                    // Note how if any of the children don't have "k", the parent also does not have "k"
                    "k"_mst.If(((acc_tl & t) << "k"_mst) && ((k <= 1) ||
                        ((k > 1) && !(((acc_tl << "g"_mst) && (t << "h"_mst)) ||
                        ((acc_tl << "h"_mst) && (t << "g"_mst)) ||
                        ((acc_tl << "i"_mst) && (t << "j"_mst)) ||
                        ((acc_tl << "j"_mst) && (t << "i"_mst))))));
            }
            return "Bdu"_mst |
                   "z"_mst.If(args == 0) | // z=all z
                   "o"_mst.If(args == 1) | // o=all z except one o
                   "e"_mst.If(all_e && num_s == n_subs) | // e=all e and all s
                   "m"_mst.If(all_e && all_m && num_s >= n_subs - k) | // m=all e, >=(n-k) s
                   "s"_mst.If(num_s >= n_subs - k + 1) |  // s= >=(n-k+1) s
                   acc_tl; // timelock info
            }
    }
    assert(false);
}